

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

Result wabt::ParseDouble(LiteralType literal_type,char *s,char *end,uint64_t *out_bits)

{
  Enum EVar1;
  
  EVar1 = (*(code *)(&DAT_011e7c0c + *(int *)(&DAT_011e7c0c + (ulong)literal_type * 4)))();
  return (Result)EVar1;
}

Assistant:

Result ParseDouble(LiteralType literal_type,
                   const char* s,
                   const char* end,
                   uint64_t* out_bits) {
  return FloatParser<double>::Parse(literal_type, s, end, out_bits);
}